

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixtree.hpp
# Opt level: O2

void __thiscall RadixTree::insert(RadixTree *this,uint64_t vadd,uint64_t padd)

{
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
  *pvVar1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
  *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  long *plVar2;
  ulong uVar3;
  uint uVar4;
  allocator_type local_23;
  allocator_type local_22;
  allocator_type local_21;
  ulong uVar5;
  
  uVar4 = (uint)vadd & 0x1ff;
  uVar5 = (ulong)uVar4;
  pvVar1 = (this->t_).
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar5];
  if (pvVar1 == (vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
                 *)0x0) {
    pvVar1 = (vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
              *)operator_new(0x18);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
    ::vector(pvVar1,0x200,&local_21);
    *(vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
      **)((long)(this->t_).
                super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar4 * 8)) = pvVar1;
    pvVar1 = *(vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
               **)((long)(this->t_).
                         super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start + (ulong)(uVar4 * 8));
  }
  plVar2 = *(long **)(*(long *)&(pvVar1->
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>
                                )._M_impl + uVar5 * 8);
  if (plVar2 == (long *)0x0) {
    this_00 = (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
               *)operator_new(0x18);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
    ::vector(this_00,0x200,&local_22);
    uVar3 = (ulong)(uVar4 * 8);
    *(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>
      **)(**(long **)((long)(this->t_).
                            super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar3) + uVar3) = this_00;
    plVar2 = *(long **)(**(long **)((long)(this->t_).
                                          super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar3) + uVar3
                       );
  }
  plVar2 = *(long **)(*plVar2 + uVar5 * 8);
  if (plVar2 == (long *)0x0) {
    this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_01,0x200,&local_23);
    uVar3 = (ulong)(uVar4 * 8);
    *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
     (**(long **)(**(long **)((long)(this->t_).
                                    super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar3) + uVar3) +
     uVar3) = this_01;
    plVar2 = *(long **)(**(long **)(**(long **)((long)(this->t_).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*,_std::allocator<std::vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_*>_>_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar3)
                                   + uVar3) + uVar3);
  }
  *(uint64_t *)(*plVar2 + uVar5 * 8) = padd & 0xffffffffff000;
  this->s_ = this->s_ + 1;
  return;
}

Assistant:

void insert(uint64_t vadd, uint64_t padd) {
    uint16_t p4k = p4_key(vadd);
    uint16_t p3k = p3_key(vadd);
    uint16_t p2k = p2_key(vadd);
    uint16_t p1k = p1_key(vadd);
    if(t_[p4k] == NULL)
      t_[p4k] = new vector< vector< vector<uint64_t>* >* >(p3_size);
    if((*t_[p4k])[p3k] == NULL)
      (*t_[p4k])[p3k] = new vector< vector<uint64_t>* >(p2_size);
    if((*(*t_[p4k])[p3k])[p2k] == NULL)
      (*(*t_[p4k])[p3k])[p2k] = new vector<uint64_t>(p1_size);
    (*(*(*t_[p4k])[p3k])[p2k])[p1k] = pb_add(padd) << 12;
    ++s_;
  }